

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

int Am_Font_Data::remove(char *__filename)

{
  XFontStruct *local_28;
  Font_Index *curr_index;
  Font_Index *prev;
  Am_Font_Data *curr;
  Display *display_local;
  
  prev = (Font_Index *)list;
  do {
    if (prev == (Font_Index *)0x0) {
      return 0;
    }
    if (prev[1].dpy == (Display *)__filename) {
      XFreeFont(prev[1].dpy,prev->next);
      prev[1].dpy = (Display *)0x0;
    }
    curr_index = (Font_Index *)0x0;
    for (local_28 = prev[1].xfont; local_28 != (XFontStruct *)0x0;
        local_28 = *(XFontStruct **)&local_28->direction) {
      if ((Display *)local_28->ext_data == (Display *)__filename) {
        if (curr_index == (Font_Index *)0x0) {
          prev[1].xfont = *(XFontStruct **)&local_28->direction;
        }
        else {
          curr_index->next = *(Font_Index **)&local_28->direction;
        }
        XFreeFont((Display *)local_28->ext_data,(XFontStruct *)local_28->fid);
        if (local_28 != (XFontStruct *)0x0) {
          operator_delete(local_28);
        }
        break;
      }
      curr_index = (Font_Index *)local_28;
    }
    prev = (Font_Index *)prev[3].dpy;
  } while( true );
}

Assistant:

void
Am_Font_Data::remove(Display *display)
{
  Am_Font_Data *curr;
  for (curr = list; curr; curr = curr->next) {
    if (curr->main_display == display) {
      XFreeFont(curr->main_display, curr->main_xfont);
      curr->main_display = nullptr;
    }
    Font_Index *prev = nullptr;
    Font_Index *curr_index = curr->font_head;
    while (curr_index) {
      if (curr_index->dpy == display) {
        if (prev)
          prev->next = curr_index->next;
        else
          curr->font_head = curr_index->next;
        XFreeFont(curr_index->dpy, curr_index->xfont);
        delete curr_index;
        break;
      }
      prev = curr_index;
      curr_index = curr_index->next;
    }
  }
}